

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

void __thiscall QDockAreaLayoutInfo::add(QDockAreaLayoutInfo *this,QWidget *widget)

{
  QDockAreaLayoutInfo *this_00;
  long *plVar1;
  QPlaceHolderItem *pQVar2;
  QDockWidget *dockWidget;
  QArrayData *this_01;
  QWidget *pQVar3;
  pointer pQVar4;
  QDockAreaLayoutInfo *this_02;
  long lVar5;
  ulong uVar6;
  long in_FS_OFFSET;
  QArrayData *local_50;
  QDockAreaLayoutInfo *local_48;
  QPlaceHolderItem *pQStack_40;
  int local_38;
  undefined8 local_34;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  indexOf((QList<int> *)&stack0xffffffffffffffb0,this,widget);
  pQVar2 = pQStack_40;
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,4,0x10);
    }
  }
  if (pQVar2 == (QPlaceHolderItem *)0x0) {
    dockWidget = (QDockWidget *)QMetaObject::cast((QObject *)&QDockWidget::staticMetaObject);
    if (dockWidget == (QDockWidget *)0x0) {
      pQVar3 = (QWidget *)QMetaObject::cast((QObject *)&QDockWidgetGroupWindow::staticMetaObject);
      if (pQVar3 == (QWidget *)0x0) {
        this_02 = (QDockAreaLayoutInfo *)&stack0xffffffffffffffb0;
        add(this_02);
        if ((this_02->item_list).d.size != 0) {
          lVar5 = 0;
          uVar6 = 0;
          do {
            pQVar4 = QList<QDockAreaLayoutItem>::data(&this_02->item_list);
            this_00 = *(QDockAreaLayoutInfo **)((long)&pQVar4->subinfo + lVar5);
            if (this_00 == (QDockAreaLayoutInfo *)0x0) {
              plVar1 = *(long **)((long)&pQVar4->widgetItem + lVar5);
              if (plVar1 != (long *)0x0) {
                (**(code **)(*plVar1 + 8))();
              }
              *(undefined8 *)((long)&pQVar4->widgetItem + lVar5) = 0;
            }
            else {
              deleteAllLayoutItems(this_00);
            }
            uVar6 = uVar6 + 1;
            lVar5 = lVar5 + 0x28;
          } while (uVar6 < (ulong)(this_02->item_list).d.size);
        }
        return;
      }
      local_50 = (QArrayData *)operator_new(0x18);
      (((Alignment *)&local_50->alloc)->super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>).
      super_QFlagsStorage<Qt::AlignmentFlag>.i = 0;
      *(QWidget **)(local_50 + 1) = pQVar3;
      *(undefined ***)local_50 = &PTR__QWidgetItem_007f1fe8;
      local_48 = (QDockAreaLayoutInfo *)0x0;
      pQStack_40 = (QPlaceHolderItem *)0x0;
      local_38 = 0;
      local_34 = 0xffffffff;
      QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::emplace<QDockAreaLayoutItem>
                ((QGenericArrayOps<QDockAreaLayoutItem> *)&this->item_list,(this->item_list).d.size,
                 (QDockAreaLayoutItem *)&stack0xffffffffffffffb0);
      QList<QDockAreaLayoutItem>::end(&this->item_list);
    }
    else {
      this_01 = (QArrayData *)operator_new(0x18);
      QDockWidgetItem::QDockWidgetItem((QDockWidgetItem *)this_01,dockWidget);
      local_48 = (QDockAreaLayoutInfo *)0x0;
      pQStack_40 = (QPlaceHolderItem *)0x0;
      local_38 = 0;
      local_34 = 0xffffffff;
      local_50 = this_01;
      QtPrivate::QGenericArrayOps<QDockAreaLayoutItem>::emplace<QDockAreaLayoutItem>
                ((QGenericArrayOps<QDockAreaLayoutItem> *)&this->item_list,(this->item_list).d.size,
                 (QDockAreaLayoutItem *)&stack0xffffffffffffffb0);
      QList<QDockAreaLayoutItem>::end(&this->item_list);
    }
    QDockAreaLayoutItem::~QDockAreaLayoutItem((QDockAreaLayoutItem *)&stack0xffffffffffffffb0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDockAreaLayoutInfo::add(QWidget *widget)
{
    // Do not add twice
    if (!indexOf(widget).isEmpty())
        return;

    if (auto *dockWidget = qobject_cast<QDockWidget *>(widget)) {
        item_list.append(QDockAreaLayoutItem(new QDockWidgetItem(dockWidget)));
        return;
    }

    if (auto *groupWindow = qobject_cast<QDockWidgetGroupWindow *>(widget)) {
        item_list.append(QDockAreaLayoutItem(new QDockWidgetGroupWindowItem(groupWindow)));
        return;
    }

    qFatal("Coding error. Add supports only QDockWidget and QDockWidgetGroupWindow");
}